

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicLinearAllocator.hpp
# Opt level: O0

void * __thiscall
Diligent::DynamicLinearAllocator::Allocate(DynamicLinearAllocator *this,size_t size,size_t align)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference pvVar3;
  Char *Message;
  undefined1 local_90 [8];
  string msg;
  uchar *Ptr;
  value_type *block;
  ulong local_58;
  size_t BlockSize;
  uchar *Ptr_1;
  Block *block_1;
  iterator __end2;
  iterator __begin2;
  vector<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  *__range2;
  size_t align_local;
  size_t size_local;
  DynamicLinearAllocator *this_local;
  
  if (size == 0) {
    this_local = (DynamicLinearAllocator *)0x0;
  }
  else {
    __end2 = std::
             vector<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
             ::begin(&this->m_Blocks);
    block_1 = (Block *)std::
                       vector<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
                       ::end(&this->m_Blocks);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Diligent::DynamicLinearAllocator::Block_*,_std::vector<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>_>
                                       *)&block_1), bVar1) {
      Ptr_1 = (uchar *)__gnu_cxx::
                       __normal_iterator<Diligent::DynamicLinearAllocator::Block_*,_std::vector<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>_>
                       ::operator*(&__end2);
      BlockSize = (size_t)AlignUp<unsigned_char,unsigned_long>(((reference)Ptr_1)->CurrPtr,align);
      if ((uchar *)(BlockSize + size) <= (uchar *)(*(long *)Ptr_1 + *(long *)(Ptr_1 + 8))) {
        *(uchar **)(Ptr_1 + 0x10) = (uchar *)(BlockSize + size);
        return (uchar *)BlockSize;
      }
      __gnu_cxx::
      __normal_iterator<Diligent::DynamicLinearAllocator::Block_*,_std::vector<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>_>
      ::operator++(&__end2);
    }
    for (local_58 = (ulong)this->m_BlockSize; local_58 < (size + align) - 1;
        local_58 = local_58 << 1) {
    }
    iVar2 = (**this->m_pAllocator->_vptr_IMemoryAllocator)
                      (this->m_pAllocator,local_58,"dynamic linear allocator page",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/DynamicLinearAllocator.hpp"
                       ,0x6a);
    block = (value_type *)CONCAT44(extraout_var,iVar2);
    std::
    vector<Diligent::DynamicLinearAllocator::Block,std::allocator<Diligent::DynamicLinearAllocator::Block>>
    ::emplace_back<void*,unsigned_long&>
              ((vector<Diligent::DynamicLinearAllocator::Block,std::allocator<Diligent::DynamicLinearAllocator::Block>>
                *)this,&block,&local_58);
    pvVar3 = std::
             vector<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
             ::back(&this->m_Blocks);
    msg.field_2._8_8_ = AlignUp<unsigned_char,unsigned_long>(pvVar3->Data,align);
    if (pvVar3->Data + pvVar3->Size < (uint8_t *)(msg.field_2._8_8_ + size)) {
      FormatString<char[50]>
                ((string *)local_90,
                 (char (*) [50])"Not enough space in the new block - this is a bug");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/DynamicLinearAllocator.hpp"
                 ,0x6e);
      std::__cxx11::string::~string((string *)local_90);
    }
    pvVar3->CurrPtr = (uint8_t *)(msg.field_2._8_8_ + size);
    this_local = (DynamicLinearAllocator *)msg.field_2._8_8_;
  }
  return this_local;
}

Assistant:

NODISCARD void* Allocate(size_t size, size_t align)
    {
        if (size == 0)
            return nullptr;

        for (auto& block : m_Blocks)
        {
            auto* Ptr = AlignUp(block.CurrPtr, align);
            if (Ptr + size <= block.Data + block.Size)
            {
                block.CurrPtr = Ptr + size;
                return Ptr;
            }
        }

        // Create a new block
        size_t BlockSize = m_BlockSize;
        while (BlockSize < size + align - 1)
            BlockSize *= 2;
        m_Blocks.emplace_back(m_pAllocator->Allocate(BlockSize, "dynamic linear allocator page", __FILE__, __LINE__), BlockSize);

        auto& block = m_Blocks.back();
        auto* Ptr   = AlignUp(block.Data, align);
        VERIFY(Ptr + size <= block.Data + block.Size, "Not enough space in the new block - this is a bug");
        block.CurrPtr = Ptr + size;
        return Ptr;
    }